

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O3

void __thiscall PluginFverb::run(PluginFverb *this,float **inputs,float **outputs,uint32_t frames)

{
  Fverb *this_00;
  uint uVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  EVP_PKEY_CTX *ctx;
  int result;
  uint local_34;
  
  uVar1 = MXCSR;
  if (frames != 0) {
    local_34 = MXCSR | 0x8040;
    MXCSR = local_34;
    if (0.5 < this->fBypass || this->fBypass == 0.5) {
      lVar3 = 0;
      bVar2 = true;
      do {
        bVar4 = bVar2;
        if (inputs[lVar3] != outputs[lVar3]) {
          memmove(outputs[lVar3],inputs[lVar3],(ulong)frames << 2);
        }
        lVar3 = 1;
        bVar2 = false;
      } while (bVar4);
      this->fWasBypass = true;
    }
    else {
      ctx = (EVP_PKEY_CTX *)inputs;
      if (this->fWasBypass == true) {
        clear(this);
        this->fWasBypass = false;
      }
      if (this->fVintage != this->fWasVintage) {
        this_00 = (this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
                  super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.
                  super__Head_base<0UL,_Fverb_*,_false>._M_head_impl;
        if (this->fVintage == false) {
          DISTRHO::Plugin::getSampleRate(&this->super_Plugin);
        }
        Fverb::init(this_00,ctx);
        clear(this);
        this->fWasVintage = this->fVintage;
      }
      runSegmented(this,inputs,outputs,frames);
    }
  }
  MXCSR = uVar1;
  return;
}

Assistant:

void PluginFverb::run(const float **inputs, float **outputs, uint32_t frames)
{
    if (frames < 1)
        return;

    WebCore::DenormalDisabler dd;

    if (fBypass < 0.5f) {
        // TODO make it smooth
        if (fWasBypass) {
            clear();
            fWasBypass = false;
        }
        if (fVintage != fWasVintage) {
            fDsp->init(fVintage ? kVintageSampleRate : getSampleRate());
            clear();
            fWasVintage = fVintage;
        }
        runSegmented(inputs, outputs, frames);
    }
    else {
        for (uint32_t ch = 0; ch < kNumChannels; ++ch) {
            if (inputs[ch] != outputs[ch])
                std::copy_n(inputs[ch], frames, outputs[ch]);
        }
        fWasBypass = true;
    }
}